

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_ReplaceChannel(ReplaceChannelForm2 ReplaceChannel)

{
  value_type vVar1;
  value_type vVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  uint uVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> verificationArray;
  uint8_t channelId;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  size;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined4 in_stack_fffffffffffffdc8;
  uint32_t in_stack_fffffffffffffdcc;
  uint8_t in_stack_fffffffffffffdd6;
  uint8_t in_stack_fffffffffffffdd7;
  uint32_t in_stack_fffffffffffffdd8;
  uint32_t in_stack_fffffffffffffddc;
  Image *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  uint8_t in_stack_fffffffffffffdef;
  value_type vVar9;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_stack_fffffffffffffdf0;
  uint32_t in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  uint8_t value;
  uint32_t *in_stack_fffffffffffffe10;
  uint32_t *in_stack_fffffffffffffe18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe20;
  size_type sVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_stack_fffffffffffffe30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  value_type vVar11;
  undefined1 isAnyValue;
  uint32_t in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  uint32_t width;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *this_01;
  Image *image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_158;
  byte local_139;
  undefined4 local_138;
  undefined4 local_134;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_130;
  undefined1 local_118 [36];
  pair<unsigned_int,_unsigned_int> local_f4;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_e8 [2];
  undefined1 local_a8 [96];
  undefined1 local_48 [40];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_8;
  
  value = (uint8_t)((uint)in_stack_fffffffffffffdfc >> 0x18);
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_fffffffffffffdcc);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,
             in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd6);
  Test_Helper::uniformImage
            (value,in_stack_fffffffffffffdf8,(uint32_t)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
             (Image *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1df3ed);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,
             in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd6);
  Test_Helper::uniformRGBImage(in_stack_fffffffffffffdef,in_stack_fffffffffffffde0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1df452);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)0x1df467);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(in_stack_fffffffffffffdf0,CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
           (allocator_type *)in_stack_fffffffffffffde0);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)0x1df490);
  local_f4 = Unit_Test::imageSize
                       ((Image *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  pvVar4 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](local_e8,0);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar4,&local_f4);
  local_118._28_8_ =
       Unit_Test::imageSize((Image *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  this_01 = local_e8;
  pvVar4 = std::
           vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ::operator[](this_01,1);
  std::pair<unsigned_int,_unsigned_int>::operator=(pvVar4,(type)(local_118 + 0x1c));
  image = (Image *)local_118;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1df53e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1df553);
  Unit_Test::generateRoi
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  local_139 = Test_Helper::randomValue<unsigned_char>(0x1df58c);
  width = CONCAT13(local_139,(int3)in_stack_fffffffffffffe5c);
  sVar10 = 0;
  this = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,0);
  vVar1 = *pvVar5;
  this_00 = &local_130;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,sVar10);
  vVar2 = *pvVar5;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this,1);
  vVar11 = *pvVar5;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,1);
  uVar8 = (uint)local_139;
  (*(code *)local_8)(local_48,vVar1,vVar2,local_a8,vVar11,*pvVar5,local_134,local_138);
  isAnyValue = (undefined1)(vVar11 >> 0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1df6a3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdf0,
             CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
             (value_type_conflict *)in_stack_fffffffffffffde0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffddc,uVar8));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1df6ce);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  vVar9 = *pvVar6;
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&local_158,(ulong)local_139);
  *pvVar7 = vVar9;
  sVar10 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_118,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_130,sVar10);
  bVar3 = Unit_Test::verifyImage
                    (image,(uint32_t)((ulong)this_01 >> 0x20),(uint32_t)this_01,width,
                     in_stack_fffffffffffffe58,local_8,(bool)isAnyValue);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffde0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffde0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffde0);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             *)in_stack_fffffffffffffde0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1df7ad);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1df7ba);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffde0);
  return bVar3;
}

Assistant:

bool form2_ReplaceChannel(ReplaceChannelForm2 ReplaceChannel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const PenguinV_Image::Image input = uniformImage( intensity[0] );
        PenguinV_Image::Image output = uniformRGBImage( intensity[1] );

        std::vector < std::pair <uint32_t, uint32_t> > size( 2 );

        size[0] = imageSize( input );
        size[1] = imageSize( output );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( size, roiX, roiY, roiWidth, roiHeight );

        const uint8_t channelId = randomValue<uint8_t>( 3 );

        ReplaceChannel( input, roiX[0], roiY[0], output, roiX[1], roiY[1], roiWidth, roiHeight, channelId );

        std::vector<uint8_t> verificationArray( 3, intensity[1] );
        verificationArray[channelId] = intensity[0];

        return verifyImage( output, roiX[1], roiY[1], roiWidth, roiHeight, verificationArray, false );
    }